

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

bool __thiscall Js::JavascriptMap::Get(JavascriptMap *this,Var key,Var *value)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  MapDataNode *pMVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  MapDataNode *local_50;
  MapDataNode *local_48;
  Var key_local;
  MapDataNode *node;
  Var simpleVar;
  
  pTVar3 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  TVar2 = this->kind;
  if (TVar2 != EmptyMap) {
    local_48 = (MapDataNode *)key;
    if (TVar2 == ComplexVarMap) {
      key_local = (Var)0x0;
      bVar6 = JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<void*>
                        ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->u,&local_48,
                         (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                          **)&key_local);
      if (bVar6) {
        pMVar4 = *(MapDataNode **)((long)key_local + 0x18);
        Memory::Recycler::WBSetBit((char *)&node);
        node = pMVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&node);
        *value = node;
      }
      goto LAB_00cd3780;
    }
    if (TVar2 == SimpleVarMap) {
      key_local = (Var)0x0;
      bVar6 = JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<void*>
                        ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->u,&local_48,
                         (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                          **)&key_local);
      if (bVar6) {
        pMVar4 = *(MapDataNode **)((long)key_local + 0x18);
        Memory::Recycler::WBSetBit((char *)&node);
        node = pMVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&node);
      }
      else {
        node = (MapDataNode *)JavascriptConversion::TryCanonicalizeAsSimpleVar<true>(local_48);
        bVar6 = false;
        if ((node == (MapDataNode *)0x0) || (node == local_48)) goto LAB_00cd3780;
        bVar6 = JsUtil::
                BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::TryGetValue<void*>
                          ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)this->u,&node,
                           (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                            **)&key_local);
        if (!bVar6) goto LAB_00cd377d;
        pMVar4 = *(MapDataNode **)((long)key_local + 0x18);
        Memory::Recycler::WBSetBit((char *)&local_50);
        local_50 = pMVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
        node = local_50;
      }
      *value = node;
      bVar6 = true;
      goto LAB_00cd3780;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x1bc,"((0))","(0)");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
LAB_00cd377d:
  bVar6 = false;
LAB_00cd3780:
  pTVar3->noJsReentrancy = bVar1;
  return bVar6;
}

Assistant:

bool
JavascriptMap::Get(Var key, Var* value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        return false;

    case MapKind::SimpleVarMap:
    {
        // First check if the key is in the map
        MapDataNode* node = nullptr;
        if (this->u.simpleVarMap->TryGetValue(key, &node))
        {
            *value = node->data.Value();
            return true;
        }
        // If the key isn't in the map, check if the canonical value is
        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<true /* allowLossyConversion */>(key);
        // If the simple var is the same as the original key, we know it isn't in the map
        if (!simpleVar || simpleVar == key)
        {
            return false;
        }

        if (!this->u.simpleVarMap->TryGetValue(simpleVar, &node))
        {
            return false;
        }
        *value = node->data.Value();
        return true;
    }
    case MapKind::ComplexVarMap:
    {
        MapDataNode * node = nullptr;
        if (!this->u.complexVarMap->TryGetValue(key, &node))
        {
            return false;
        }
        *value = node->data.Value();
        return true;
    }
    default:
        Assume(UNREACHED);
        return false;
    }
}